

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O1

QString * appendSlashIfNeeded(QString *__return_storage_ptr__,QString *path)

{
  Data *pDVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((path->d).size != 0) {
    bVar2 = QString::endsWith(path,(QChar)0x2f,CaseSensitive);
    if (!bVar2) {
      local_28.b = L'/';
      local_28.a = path;
      QStringBuilder<const_QString_&,_char16_t>::convertTo<QString>
                (__return_storage_ptr__,&local_28);
      goto LAB_001368a9;
    }
  }
  pDVar1 = (path->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (path->d).ptr;
  (__return_storage_ptr__->d).size = (path->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_001368a9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QString appendSlashIfNeeded(const QString &path)
{
    if (!path.isEmpty() && !path.endsWith(u'/')
#ifdef Q_OS_ANDROID
        && !path.startsWith("content:/"_L1)
#endif
        )
        return QString{path + u'/'};
    return path;
}